

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O3

double __thiscall
brotli::ZopfliCostModel::GetCommandCost
          (ZopfliCostModel *this,size_t dist_code,size_t length_code,size_t insert_length)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  
  if (insert_length < 6) {
    uVar6 = insert_length & 0xffffffff;
  }
  else if (insert_length < 0x82) {
    uVar3 = 0x1f;
    uVar5 = (uint)(insert_length - 2);
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar6 = (ulong)((int)(insert_length - 2 >> ((char)(uVar3 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                    (uVar3 ^ 0xffffffe0) * 2 + 0x40);
  }
  else if (insert_length < 0x842) {
    uVar5 = (int)insert_length - 0x42;
    uVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar6 = (ulong)((uVar3 ^ 0xffe0) + 0x2a);
  }
  else {
    uVar6 = 0x15;
    if (0x1841 < insert_length) {
      uVar6 = (ulong)(ushort)(0x17 - (insert_length < 0x5842));
    }
  }
  if (length_code < 10) {
    uVar4 = (ulong)((int)length_code - 2);
  }
  else if (length_code < 0x86) {
    uVar3 = 0x1f;
    uVar5 = (uint)(length_code - 6);
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar4 = (ulong)((int)(length_code - 6 >> ((char)(uVar3 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                    (uVar3 ^ 0xffffffe0) * 2 + 0x42);
  }
  else {
    uVar4 = 0x17;
    if (length_code < 0x846) {
      uVar5 = (int)length_code - 0x46;
      uVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar4 = (ulong)((uVar3 ^ 0xffe0) + 0x2c);
    }
  }
  uVar1 = (ushort)uVar4;
  uVar2 = (uVar1 & 7) + ((ushort)uVar6 & 7) * 8;
  if (((dist_code == 0) && ((ushort)uVar6 < 8)) && (uVar1 < 0x10)) {
    if (7 < uVar1) {
      uVar2 = uVar2 | 0x40;
    }
    dist_code = 0;
    uVar3 = 0;
  }
  else {
    uVar2 = uVar2 | *(ushort *)
                     (CombineLengthCodes(unsigned_short,unsigned_short,bool)::cells +
                     (ulong)(uint)((int)((uVar6 & 0xffff) >> 3) * 3 + (int)((uVar4 & 0xffff) >> 3))
                     * 2);
    uVar3 = 0;
    if (0xf < dist_code) {
      uVar3 = 0x1f;
      uVar5 = (uint)(dist_code - 0xc);
      if (uVar5 != 0) {
        for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = (uVar3 ^ 0xffffffe0) + 0x1f;
      bVar7 = (dist_code - 0xc >> ((ulong)uVar3 & 0x3f) & 1) != 0;
      dist_code = (ulong)bVar7 + (ulong)uVar3 * 2 + 0x1000e;
      uVar3 = (uVar5 - ((bVar7 | 2) << ((byte)uVar3 & 0x3f)) | uVar3 * 0x1000000) >> 0x18;
    }
  }
  dVar8 = (double)(uVar3 + *(int *)(kInsExtra + (uVar6 & 0xffff) * 4) +
                  *(int *)(kCopyExtra + (uVar4 & 0xffff) * 4)) +
          (this->cost_cmd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar2];
  if (0x7f < uVar2) {
    dVar8 = dVar8 + (this->cost_dist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[dist_code & 0xffff];
  }
  return dVar8;
}

Assistant:

double GetCommandCost(
      size_t dist_code, size_t length_code, size_t insert_length) const {
    uint16_t inscode = GetInsertLengthCode(insert_length);
    uint16_t copycode = GetCopyLengthCode(length_code);
    uint16_t cmdcode = CombineLengthCodes(inscode, copycode, dist_code == 0);
    uint16_t dist_symbol;
    uint32_t distextra;
    PrefixEncodeCopyDistance(dist_code, 0, 0, &dist_symbol, &distextra);
    uint32_t distnumextra = distextra >> 24;

    double result =  static_cast<double>(
        kInsExtra[inscode] + kCopyExtra[copycode] + distnumextra);
    result += cost_cmd_[cmdcode];
    if (cmdcode >= 128) result += cost_dist_[dist_symbol];
    return result;
  }